

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

bool __thiscall QString::startsWith(QString *this,QString *s,CaseSensitivity cs)

{
  bool bVar1;
  QStringView needle;
  QStringView haystack;
  
  needle.m_data = (s->d).ptr;
  needle.m_size = (s->d).size;
  haystack.m_data = (this->d).ptr;
  haystack.m_size = (this->d).size;
  bVar1 = (anonymous_namespace)::qt_starts_with_impl<QStringView,QStringView>(haystack,needle,cs);
  return bVar1;
}

Assistant:

bool QString::startsWith(const QString& s, Qt::CaseSensitivity cs) const
{
    return qt_starts_with_impl(QStringView(*this), QStringView(s), cs);
}